

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O1

void __thiscall CoreML::Specification::MILSpec::Operation::Clear(Operation *this)

{
  google::protobuf::
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>
  ::InnerMap::clear((InnerMap *)&this->inputs_);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<CoreML::Specification::MILSpec::NamedValueType>::TypeHandler>
            (&(this->outputs_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<CoreML::Specification::MILSpec::Block>::TypeHandler>
            (&(this->blocks_).super_RepeatedPtrFieldBase);
  google::protobuf::
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
  ::InnerMap::clear((InnerMap *)&this->attributes_);
  google::protobuf::internal::ArenaStringPtr::ClearToEmpty(&this->type_);
  if (((this->super_MessageLite)._internal_metadata_.ptr_ & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoClear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void Operation::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.MILSpec.Operation)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  inputs_.Clear();
  outputs_.Clear();
  blocks_.Clear();
  attributes_.Clear();
  type_.ClearToEmpty();
  _internal_metadata_.Clear<std::string>();
}